

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O2

bool RESTERR(HTTPRequest *req,HTTPStatusCode status,string *message)

{
  long in_FS_OFFSET;
  allocator<char> local_6a;
  allocator<char> local_69;
  string local_68;
  span<const_std::byte,_18446744073709551615UL> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Content-Type",&local_69);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"text/plain",&local_6a);
  HTTPRequest::WriteHeader(req,(string *)&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48,
                 message,"\r\n");
  HTTPRequest::WriteReply(req,status,local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return SUB81(*(long *)(in_FS_OFFSET + 0x28),0);
  }
  __stack_chk_fail();
}

Assistant:

static bool RESTERR(HTTPRequest* req, enum HTTPStatusCode status, std::string message)
{
    req->WriteHeader("Content-Type", "text/plain");
    req->WriteReply(status, message + "\r\n");
    return false;
}